

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.cpp
# Opt level: O1

Complex __thiscall libDAI::BP::logZ(BP *this)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TFactor<double> *P;
  undefined4 extraout_var_04;
  TFactor<double> *Q;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar9;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 uVar10;
  undefined8 extraout_XMM1_Qb;
  undefined8 uVar11;
  undefined1 in_XMM4 [16];
  undefined1 auVar12 [16];
  undefined1 local_c8 [16];
  double local_b8;
  double dStack_b0;
  Factor local_a0;
  complex<double> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x28))
                    ((long *)CONCAT44(extraout_var,iVar4));
  uVar8 = 0;
  if (lVar5 == 0) {
    local_c8 = ZEXT816(0);
  }
  else {
    local_c8 = ZEXT816(0);
    lVar5 = 8;
    sVar7 = 0;
    uVar9 = extraout_XMM1_Qa;
    do {
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      lVar1 = *(long *)(CONCAT44(extraout_var_00,iVar4) + 0x70);
      lVar2 = *(long *)(lVar1 + -8 + lVar5);
      lVar1 = *(long *)(lVar1 + lVar5);
      beliefV(&local_a0,this,sVar7);
      TProb<double>::entropy(&local_a0._p);
      auVar12 = vcvtusi2sd_avx512f(in_XMM4,lVar1 - lVar2 >> 3);
      local_b8 = 1.0 - auVar12._0_8_;
      dStack_b0 = 0.0;
      local_68._M_value._0_8_ = uVar8;
      local_68._M_value._8_8_ = uVar9;
      std::complex<double>::operator*=((complex<double> *)&local_b8,&local_68);
      local_c8._8_8_ = (double)local_c8._8_8_ + dStack_b0;
      local_c8._0_8_ = (double)local_c8._0_8_ + local_b8;
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      sVar7 = sVar7 + 1;
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x28))
                        ((long *)CONCAT44(extraout_var_01,iVar4));
      lVar5 = lVar5 + 0x18;
      uVar8 = extraout_XMM0_Qa;
      uVar9 = extraout_XMM1_Qa_00;
    } while (sVar7 < uVar6);
  }
  iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  auVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x48))
                      ((long *)CONCAT44(extraout_var_02,iVar4));
  if (auVar12._0_8_ != 0) {
    sVar7 = 0;
    do {
      beliefF(&local_a0,this,sVar7);
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      P = (TFactor<double> *)
          (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x50))
                    ((long *)CONCAT44(extraout_var_03,iVar4),sVar7);
      uVar8 = extraout_XMM0_Qa_00;
      uVar9 = extraout_XMM0_Qb;
      uVar10 = extraout_XMM1_Qa_01;
      uVar11 = extraout_XMM1_Qb;
      KL_dist<double>((libDAI *)&local_a0,P,Q);
      local_58 = uVar10;
      uStack_50 = uVar11;
      local_48 = uVar8;
      uStack_40 = uVar9;
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      auVar3._8_8_ = uStack_40;
      auVar3._0_8_ = local_48;
      auVar12._8_8_ = uStack_50;
      auVar12._0_8_ = local_58;
      auVar12 = vunpcklpd_avx(auVar3,auVar12);
      local_c8 = vsubpd_avx(local_c8,auVar12);
      sVar7 = sVar7 + 1;
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      auVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x48))
                          ((long *)CONCAT44(extraout_var_04,iVar4));
    } while (sVar7 < auVar12._0_8_);
  }
  vshufpd_avx(local_c8,local_c8,1);
  return (Complex)(_ComplexT)auVar12;
}

Assistant:

Complex BP::logZ() const {
        Complex sum = 0.0;
        for(size_t i = 0; i < grm().nrVars(); i++ )
            sum += Complex(1.0 - grm().nbV(i).size()) * beliefV(i).entropy();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum -= KL_dist( beliefF(I), grm().factor(I) );
        return sum;
    }